

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMvMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  undefined4 uVar8;
  float fVar9;
  undefined4 uVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  ulong uVar17;
  byte bVar18;
  AABBNodeMB4D *node1;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  NodeRef *pNVar24;
  ulong uVar25;
  size_t sVar26;
  ulong uVar27;
  ulong uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  NodeRef *local_a78;
  undefined1 local_a38 [16];
  ulong local_a28;
  long local_a20;
  Scene *local_a18;
  long local_a10;
  undefined1 local_a08 [16];
  undefined1 local_9f8 [16];
  undefined1 local_9e8 [16];
  undefined1 local_9d8 [16];
  undefined1 local_9c8 [16];
  undefined1 local_9b8 [16];
  undefined1 local_9a8 [16];
  RTCFilterFunctionNArguments args;
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  RTCHitN local_868 [16];
  undefined1 local_858 [16];
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  uint local_7f8;
  uint uStack_7f4;
  uint uStack_7f0;
  uint uStack_7ec;
  uint uStack_7e8;
  uint uStack_7e4;
  uint uStack_7e0;
  uint uStack_7dc;
  NodeRef stack [244];
  float fVar2;
  float fVar3;
  
  stack[0] = root;
  auVar29 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar60 = ZEXT1664(auVar29);
  auVar29 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar61 = ZEXT1664(auVar29);
  auVar29 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar62 = ZEXT1664(auVar29);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar6 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar29 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar4 * 0.99999964)));
  auVar63 = ZEXT1664(auVar29);
  auVar29 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar5 * 0.99999964)));
  auVar64 = ZEXT1664(auVar29);
  auVar29 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar6 * 0.99999964)));
  auVar65 = ZEXT1664(auVar29);
  fVar4 = fVar4 * 1.0000004;
  fVar5 = fVar5 * 1.0000004;
  fVar6 = fVar6 * 1.0000004;
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar21 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar7 = (tray->tnear).field_0.i[k];
  auVar54._4_4_ = iVar7;
  auVar54._0_4_ = iVar7;
  auVar54._8_4_ = iVar7;
  auVar54._12_4_ = iVar7;
  iVar7 = (tray->tfar).field_0.i[k];
  auVar56._4_4_ = iVar7;
  auVar56._0_4_ = iVar7;
  auVar56._8_4_ = iVar7;
  auVar56._12_4_ = iVar7;
  auVar29 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_a78 = stack + 1;
LAB_01cc0765:
  do {
    pNVar24 = local_a78;
    if (pNVar24 == stack) {
LAB_01cc111a:
      return pNVar24 != stack;
    }
    local_a78 = pNVar24 + -1;
    sVar26 = pNVar24[-1].ptr;
    while ((sVar26 & 8) == 0) {
      uVar19 = sVar26 & 0xfffffffffffffff0;
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar37._4_4_ = uVar8;
      auVar37._0_4_ = uVar8;
      auVar37._8_4_ = uVar8;
      auVar37._12_4_ = uVar8;
      auVar30 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x80 + uVar25),auVar37,
                                *(undefined1 (*) [16])(uVar19 + 0x20 + uVar25));
      auVar30 = vsubps_avx512vl(auVar30,auVar60._0_16_);
      auVar30 = vmulps_avx512vl(auVar63._0_16_,auVar30);
      auVar30 = vmaxps_avx(auVar54,auVar30);
      auVar31 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x80 + uVar21),auVar37,
                                *(undefined1 (*) [16])(uVar19 + 0x20 + uVar21));
      auVar31 = vsubps_avx512vl(auVar31,auVar61._0_16_);
      auVar32 = vmulps_avx512vl(auVar64._0_16_,auVar31);
      auVar31 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x80 + uVar27),auVar37,
                                *(undefined1 (*) [16])(uVar19 + 0x20 + uVar27));
      auVar31 = vsubps_avx512vl(auVar31,auVar62._0_16_);
      auVar31 = vmulps_avx512vl(auVar65._0_16_,auVar31);
      auVar31 = vmaxps_avx(auVar32,auVar31);
      auVar30 = vmaxps_avx(auVar30,auVar31);
      auVar31 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x80 + (uVar25 ^ 0x10)),auVar37,
                                *(undefined1 (*) [16])(uVar19 + 0x20 + (uVar25 ^ 0x10)));
      auVar31 = vsubps_avx512vl(auVar31,auVar60._0_16_);
      auVar32._0_4_ = fVar4 * auVar31._0_4_;
      auVar32._4_4_ = fVar4 * auVar31._4_4_;
      auVar32._8_4_ = fVar4 * auVar31._8_4_;
      auVar32._12_4_ = fVar4 * auVar31._12_4_;
      auVar31 = vminps_avx(auVar56,auVar32);
      auVar32 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x80 + (uVar21 ^ 0x10)),auVar37,
                                *(undefined1 (*) [16])(uVar19 + 0x20 + (uVar21 ^ 0x10)));
      auVar32 = vsubps_avx512vl(auVar32,auVar61._0_16_);
      auVar38._0_4_ = fVar5 * auVar32._0_4_;
      auVar38._4_4_ = fVar5 * auVar32._4_4_;
      auVar38._8_4_ = fVar5 * auVar32._8_4_;
      auVar38._12_4_ = fVar5 * auVar32._12_4_;
      auVar32 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x80 + (uVar27 ^ 0x10)),auVar37,
                                *(undefined1 (*) [16])(uVar19 + 0x20 + (uVar27 ^ 0x10)));
      auVar32 = vsubps_avx512vl(auVar32,auVar62._0_16_);
      auVar39._0_4_ = fVar6 * auVar32._0_4_;
      auVar39._4_4_ = fVar6 * auVar32._4_4_;
      auVar39._8_4_ = fVar6 * auVar32._8_4_;
      auVar39._12_4_ = fVar6 * auVar32._12_4_;
      auVar32 = vminps_avx(auVar38,auVar39);
      auVar31 = vminps_avx(auVar31,auVar32);
      uVar14 = vcmpps_avx512vl(auVar30,auVar31,2);
      uVar22 = (uint)uVar14;
      if (((uint)sVar26 & 7) == 6) {
        uVar15 = vcmpps_avx512vl(auVar37,*(undefined1 (*) [16])(uVar19 + 0xf0),1);
        uVar16 = vcmpps_avx512vl(auVar37,*(undefined1 (*) [16])(uVar19 + 0xe0),0xd);
        uVar22 = (uint)(byte)((byte)uVar15 & (byte)uVar16 & (byte)uVar14);
      }
      if ((byte)uVar22 == 0) goto LAB_01cc0765;
      lVar20 = 0;
      for (uVar23 = (ulong)(byte)uVar22; (uVar23 & 1) == 0;
          uVar23 = uVar23 >> 1 | 0x8000000000000000) {
        lVar20 = lVar20 + 1;
      }
      sVar26 = *(size_t *)(uVar19 + lVar20 * 8);
      uVar22 = (uVar22 & 0xff) - 1 & uVar22 & 0xff;
      uVar23 = (ulong)uVar22;
      if (uVar22 != 0) {
        do {
          local_a78->ptr = sVar26;
          local_a78 = local_a78 + 1;
          lVar20 = 0;
          for (uVar28 = uVar23; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
            lVar20 = lVar20 + 1;
          }
          uVar23 = uVar23 - 1 & uVar23;
          sVar26 = *(size_t *)(uVar19 + lVar20 * 8);
        } while (uVar23 != 0);
      }
    }
    local_a10 = (ulong)((uint)sVar26 & 0xf) - 8;
    uVar19 = sVar26 & 0xfffffffffffffff0;
    for (local_a20 = 0; local_a20 != local_a10; local_a20 = local_a20 + 1) {
      lVar20 = local_a20 * 0x140;
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar42._4_4_ = uVar8;
      auVar42._0_4_ = uVar8;
      auVar42._8_4_ = uVar8;
      auVar42._12_4_ = uVar8;
      auVar30 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x90 + lVar20),auVar42,
                                *(undefined1 (*) [16])(uVar19 + lVar20));
      auVar31 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0xa0 + lVar20),auVar42,
                                *(undefined1 (*) [16])(uVar19 + 0x10 + lVar20));
      auVar32 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0xb0 + lVar20),auVar42,
                                *(undefined1 (*) [16])(uVar19 + 0x20 + lVar20));
      auVar37 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0xc0 + lVar20),auVar42,
                                *(undefined1 (*) [16])(uVar19 + 0x30 + lVar20));
      auVar38 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0xd0 + lVar20),auVar42,
                                *(undefined1 (*) [16])(uVar19 + 0x40 + lVar20));
      auVar39 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0xe0 + lVar20),auVar42,
                                *(undefined1 (*) [16])(uVar19 + 0x50 + lVar20));
      auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0xf0 + lVar20),auVar42,
                                *(undefined1 (*) [16])(uVar19 + 0x60 + lVar20));
      auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x100 + lVar20),auVar42,
                                *(undefined1 (*) [16])(uVar19 + 0x70 + lVar20));
      auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar19 + 0x110 + lVar20),auVar42,
                                *(undefined1 (*) [16])(uVar19 + 0x80 + lVar20));
      uVar8 = *(undefined4 *)(ray + k * 4);
      auVar43._4_4_ = uVar8;
      auVar43._0_4_ = uVar8;
      auVar43._8_4_ = uVar8;
      auVar43._12_4_ = uVar8;
      auVar33 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x10)));
      auVar34 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar53._4_4_ = uVar8;
      auVar53._0_4_ = uVar8;
      auVar53._8_4_ = uVar8;
      auVar53._12_4_ = uVar8;
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x50);
      auVar55._4_4_ = uVar8;
      auVar55._0_4_ = uVar8;
      auVar55._8_4_ = uVar8;
      auVar55._12_4_ = uVar8;
      fVar9 = *(float *)(ray + k * 4 + 0x60);
      auVar58._4_4_ = fVar9;
      auVar58._0_4_ = fVar9;
      auVar58._8_4_ = fVar9;
      auVar58._12_4_ = fVar9;
      auVar30 = vsubps_avx(auVar30,auVar43);
      auVar35 = vsubps_avx512vl(auVar31,auVar33);
      auVar36 = vsubps_avx512vl(auVar32,auVar34);
      auVar37 = vsubps_avx512vl(auVar37,auVar43);
      auVar38 = vsubps_avx512vl(auVar38,auVar33);
      auVar39 = vsubps_avx512vl(auVar39,auVar34);
      auVar40 = vsubps_avx512vl(auVar40,auVar43);
      auVar41 = vsubps_avx512vl(auVar41,auVar33);
      auVar42 = vsubps_avx512vl(auVar42,auVar34);
      auVar33 = vsubps_avx512vl(auVar40,auVar30);
      auVar34 = vsubps_avx512vl(auVar41,auVar35);
      auVar31 = vsubps_avx(auVar42,auVar36);
      auVar43 = vsubps_avx512vl(auVar30,auVar37);
      auVar44 = vsubps_avx512vl(auVar35,auVar38);
      auVar45 = vsubps_avx512vl(auVar36,auVar39);
      auVar46 = vsubps_avx512vl(auVar37,auVar40);
      auVar47 = vsubps_avx512vl(auVar38,auVar41);
      auVar48 = vsubps_avx512vl(auVar39,auVar42);
      auVar32 = vaddps_avx512vl(auVar40,auVar30);
      auVar49 = vaddps_avx512vl(auVar41,auVar35);
      auVar50 = vaddps_avx512vl(auVar42,auVar36);
      auVar51 = vmulps_avx512vl(auVar49,auVar31);
      auVar51 = vfmsub231ps_avx512vl(auVar51,auVar34,auVar50);
      auVar50 = vmulps_avx512vl(auVar50,auVar33);
      auVar50 = vfmsub231ps_avx512vl(auVar50,auVar31,auVar32);
      auVar52._0_4_ = auVar34._0_4_ * auVar32._0_4_;
      auVar52._4_4_ = auVar34._4_4_ * auVar32._4_4_;
      auVar52._8_4_ = auVar34._8_4_ * auVar32._8_4_;
      auVar52._12_4_ = auVar34._12_4_ * auVar32._12_4_;
      auVar32 = vfmsub231ps_fma(auVar52,auVar33,auVar49);
      auVar49._0_4_ = fVar9 * auVar32._0_4_;
      auVar49._4_4_ = fVar9 * auVar32._4_4_;
      auVar49._8_4_ = fVar9 * auVar32._8_4_;
      auVar49._12_4_ = fVar9 * auVar32._12_4_;
      auVar32 = vfmadd231ps_avx512vl(auVar49,auVar55,auVar50);
      auVar32 = vfmadd231ps_avx512vl(auVar32,auVar53,auVar51);
      auVar49 = vaddps_avx512vl(auVar30,auVar37);
      auVar50 = vaddps_avx512vl(auVar35,auVar38);
      auVar51 = vaddps_avx512vl(auVar36,auVar39);
      auVar52 = vmulps_avx512vl(auVar50,auVar45);
      auVar52 = vfmsub231ps_avx512vl(auVar52,auVar44,auVar51);
      auVar51 = vmulps_avx512vl(auVar51,auVar43);
      auVar51 = vfmsub231ps_avx512vl(auVar51,auVar45,auVar49);
      auVar49 = vmulps_avx512vl(auVar49,auVar44);
      auVar49 = vfmsub231ps_avx512vl(auVar49,auVar43,auVar50);
      auVar50._0_4_ = fVar9 * auVar49._0_4_;
      auVar50._4_4_ = fVar9 * auVar49._4_4_;
      auVar50._8_4_ = fVar9 * auVar49._8_4_;
      auVar50._12_4_ = fVar9 * auVar49._12_4_;
      auVar49 = vfmadd231ps_avx512vl(auVar50,auVar55,auVar51);
      auVar49 = vfmadd231ps_avx512vl(auVar49,auVar53,auVar52);
      auVar50 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar37 = vaddps_avx512vl(auVar37,auVar40);
      auVar38 = vaddps_avx512vl(auVar38,auVar41);
      auVar39 = vaddps_avx512vl(auVar39,auVar42);
      auVar40 = vmulps_avx512vl(auVar38,auVar48);
      auVar40 = vfmsub231ps_avx512vl(auVar40,auVar47,auVar39);
      auVar59._0_4_ = auVar39._0_4_ * auVar46._0_4_;
      auVar59._4_4_ = auVar39._4_4_ * auVar46._4_4_;
      auVar59._8_4_ = auVar39._8_4_ * auVar46._8_4_;
      auVar59._12_4_ = auVar39._12_4_ * auVar46._12_4_;
      auVar39 = vfmsub231ps_avx512vl(auVar59,auVar48,auVar37);
      auVar37 = vmulps_avx512vl(auVar37,auVar47);
      auVar37 = vfmsub231ps_avx512vl(auVar37,auVar46,auVar38);
      auVar37 = vmulps_avx512vl(auVar37,auVar58);
      auVar37 = vfmadd231ps_avx512vl(auVar37,auVar55,auVar39);
      auVar37 = vfmadd231ps_avx512vl(auVar37,auVar53,auVar40);
      auVar51._0_4_ = auVar32._0_4_ + auVar49._0_4_;
      auVar51._4_4_ = auVar32._4_4_ + auVar49._4_4_;
      auVar51._8_4_ = auVar32._8_4_ + auVar49._8_4_;
      auVar51._12_4_ = auVar32._12_4_ + auVar49._12_4_;
      auVar38 = vaddps_avx512vl(auVar37,auVar51);
      auVar39 = vandps_avx512vl(auVar38,auVar50);
      auVar40._8_4_ = 0x34000000;
      auVar40._0_8_ = 0x3400000034000000;
      auVar40._12_4_ = 0x34000000;
      auVar40 = vmulps_avx512vl(auVar39,auVar40);
      auVar41 = vminps_avx512vl(auVar32,auVar49);
      auVar42 = vminps_avx512vl(auVar41,auVar37);
      auVar41._8_4_ = 0x80000000;
      auVar41._0_8_ = 0x8000000080000000;
      auVar41._12_4_ = 0x80000000;
      auVar41 = vxorps_avx512vl(auVar40,auVar41);
      uVar14 = vcmpps_avx512vl(auVar42,auVar41,5);
      auVar41 = vmaxps_avx512vl(auVar32,auVar49);
      auVar37 = vmaxps_avx512vl(auVar41,auVar37);
      uVar15 = vcmpps_avx512vl(auVar37,auVar40,2);
      bVar18 = ((byte)uVar14 | (byte)uVar15) & 0xf;
      if (bVar18 != 0) {
        auVar37 = vmulps_avx512vl(auVar44,auVar31);
        auVar40 = vmulps_avx512vl(auVar33,auVar45);
        auVar41 = vmulps_avx512vl(auVar43,auVar34);
        auVar42 = vmulps_avx512vl(auVar47,auVar45);
        auVar51 = vmulps_avx512vl(auVar43,auVar48);
        auVar52 = vmulps_avx512vl(auVar46,auVar44);
        auVar34 = vfmsub213ps_avx512vl(auVar34,auVar45,auVar37);
        auVar31 = vfmsub213ps_avx512vl(auVar31,auVar43,auVar40);
        auVar33 = vfmsub213ps_avx512vl(auVar33,auVar44,auVar41);
        auVar44 = vfmsub213ps_avx512vl(auVar48,auVar44,auVar42);
        auVar45 = vfmsub213ps_avx512vl(auVar46,auVar45,auVar51);
        auVar43 = vfmsub213ps_avx512vl(auVar47,auVar43,auVar52);
        auVar37 = vandps_avx512vl(auVar37,auVar50);
        auVar42 = vandps_avx512vl(auVar42,auVar50);
        uVar23 = vcmpps_avx512vl(auVar37,auVar42,1);
        auVar37 = vandps_avx512vl(auVar40,auVar50);
        auVar40 = vandps_avx512vl(auVar51,auVar50);
        uVar28 = vcmpps_avx512vl(auVar37,auVar40,1);
        auVar37 = vandps_avx512vl(auVar41,auVar50);
        auVar40 = vandps_avx512vl(auVar52,auVar50);
        uVar17 = vcmpps_avx512vl(auVar37,auVar40,1);
        bVar13 = (bool)((byte)uVar23 & 1);
        local_898._0_4_ = (uint)bVar13 * auVar34._0_4_ | (uint)!bVar13 * auVar44._0_4_;
        bVar13 = (bool)((byte)(uVar23 >> 1) & 1);
        local_898._4_4_ = (uint)bVar13 * auVar34._4_4_ | (uint)!bVar13 * auVar44._4_4_;
        bVar13 = (bool)((byte)(uVar23 >> 2) & 1);
        local_898._8_4_ = (uint)bVar13 * auVar34._8_4_ | (uint)!bVar13 * auVar44._8_4_;
        bVar13 = (bool)((byte)(uVar23 >> 3) & 1);
        local_898._12_4_ = (uint)bVar13 * auVar34._12_4_ | (uint)!bVar13 * auVar44._12_4_;
        bVar13 = (bool)((byte)uVar28 & 1);
        local_888._0_4_ = (uint)bVar13 * auVar31._0_4_ | (uint)!bVar13 * auVar45._0_4_;
        bVar13 = (bool)((byte)(uVar28 >> 1) & 1);
        local_888._4_4_ = (uint)bVar13 * auVar31._4_4_ | (uint)!bVar13 * auVar45._4_4_;
        bVar13 = (bool)((byte)(uVar28 >> 2) & 1);
        local_888._8_4_ = (uint)bVar13 * auVar31._8_4_ | (uint)!bVar13 * auVar45._8_4_;
        bVar13 = (bool)((byte)(uVar28 >> 3) & 1);
        local_888._12_4_ = (uint)bVar13 * auVar31._12_4_ | (uint)!bVar13 * auVar45._12_4_;
        bVar13 = (bool)((byte)uVar17 & 1);
        local_878._0_4_ = (float)((uint)bVar13 * auVar33._0_4_ | (uint)!bVar13 * auVar43._0_4_);
        bVar13 = (bool)((byte)(uVar17 >> 1) & 1);
        local_878._4_4_ = (float)((uint)bVar13 * auVar33._4_4_ | (uint)!bVar13 * auVar43._4_4_);
        bVar13 = (bool)((byte)(uVar17 >> 2) & 1);
        local_878._8_4_ = (float)((uint)bVar13 * auVar33._8_4_ | (uint)!bVar13 * auVar43._8_4_);
        bVar13 = (bool)((byte)(uVar17 >> 3) & 1);
        local_878._12_4_ = (float)((uint)bVar13 * auVar33._12_4_ | (uint)!bVar13 * auVar43._12_4_);
        auVar44._0_4_ = fVar9 * local_878._0_4_;
        auVar44._4_4_ = fVar9 * local_878._4_4_;
        auVar44._8_4_ = fVar9 * local_878._8_4_;
        auVar44._12_4_ = fVar9 * local_878._12_4_;
        auVar31 = vfmadd213ps_fma(auVar55,local_888,auVar44);
        auVar31 = vfmadd213ps_fma(auVar53,local_898,auVar31);
        auVar33._0_4_ = auVar31._0_4_ + auVar31._0_4_;
        auVar33._4_4_ = auVar31._4_4_ + auVar31._4_4_;
        auVar33._8_4_ = auVar31._8_4_ + auVar31._8_4_;
        auVar33._12_4_ = auVar31._12_4_ + auVar31._12_4_;
        auVar34._0_4_ = auVar36._0_4_ * local_878._0_4_;
        auVar34._4_4_ = auVar36._4_4_ * local_878._4_4_;
        auVar34._8_4_ = auVar36._8_4_ * local_878._8_4_;
        auVar34._12_4_ = auVar36._12_4_ * local_878._12_4_;
        auVar31 = vfmadd213ps_fma(auVar35,local_888,auVar34);
        auVar31 = vfmadd213ps_fma(auVar30,local_898,auVar31);
        auVar37 = vrcp14ps_avx512vl(auVar33);
        auVar30._8_4_ = 0x3f800000;
        auVar30._0_8_ = 0x3f8000003f800000;
        auVar30._12_4_ = 0x3f800000;
        auVar30 = vfnmadd213ps_avx512vl(auVar37,auVar33,auVar30);
        auVar30 = vfmadd132ps_fma(auVar30,auVar37,auVar37);
        uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar35._4_4_ = uVar8;
        auVar35._0_4_ = uVar8;
        auVar35._8_4_ = uVar8;
        auVar35._12_4_ = uVar8;
        auVar57 = ZEXT1664(auVar35);
        local_8a8._0_4_ = auVar30._0_4_ * (auVar31._0_4_ + auVar31._0_4_);
        local_8a8._4_4_ = auVar30._4_4_ * (auVar31._4_4_ + auVar31._4_4_);
        local_8a8._8_4_ = auVar30._8_4_ * (auVar31._8_4_ + auVar31._8_4_);
        local_8a8._12_4_ = auVar30._12_4_ * (auVar31._12_4_ + auVar31._12_4_);
        uVar14 = vcmpps_avx512vl(local_8a8,auVar35,2);
        uVar8 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar31._4_4_ = uVar8;
        auVar31._0_4_ = uVar8;
        auVar31._8_4_ = uVar8;
        auVar31._12_4_ = uVar8;
        uVar15 = vcmpps_avx512vl(local_8a8,auVar31,0xd);
        bVar18 = (byte)uVar14 & (byte)uVar15 & bVar18;
        if (bVar18 != 0) {
          uVar14 = vcmpps_avx512vl(auVar33,_DAT_01f45a50,4);
          bVar18 = bVar18 & (byte)uVar14;
          if (bVar18 != 0) {
            auVar36._8_4_ = 0x219392ef;
            auVar36._0_8_ = 0x219392ef219392ef;
            auVar36._12_4_ = 0x219392ef;
            uVar23 = vcmpps_avx512vl(auVar39,auVar36,5);
            auVar31 = vrcp14ps_avx512vl(auVar38);
            auVar47._8_4_ = 0x3f800000;
            auVar47._0_8_ = 0x3f8000003f800000;
            auVar47._12_4_ = 0x3f800000;
            auVar30 = vfnmadd213ps_fma(auVar38,auVar31,auVar47);
            auVar30 = vfmadd132ps_avx512vl(auVar30,auVar31,auVar31);
            fVar9 = (float)((uint)((byte)uVar23 & 1) * auVar30._0_4_);
            fVar1 = (float)((uint)((byte)(uVar23 >> 1) & 1) * auVar30._4_4_);
            fVar2 = (float)((uint)((byte)(uVar23 >> 2) & 1) * auVar30._8_4_);
            fVar3 = (float)((uint)((byte)(uVar23 >> 3) & 1) * auVar30._12_4_);
            local_a18 = context->scene;
            auVar45._0_4_ = fVar9 * auVar32._0_4_;
            auVar45._4_4_ = fVar1 * auVar32._4_4_;
            auVar45._8_4_ = fVar2 * auVar32._8_4_;
            auVar45._12_4_ = fVar3 * auVar32._12_4_;
            local_8c8 = vminps_avx(auVar45,auVar47);
            auVar46._0_4_ = fVar9 * auVar49._0_4_;
            auVar46._4_4_ = fVar1 * auVar49._4_4_;
            auVar46._8_4_ = fVar2 * auVar49._8_4_;
            auVar46._12_4_ = fVar3 * auVar49._12_4_;
            local_8b8 = vminps_avx(auVar46,auVar47);
            local_a28 = (ulong)bVar18;
            do {
              uVar23 = 0;
              for (uVar28 = local_a28; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000)
              {
                uVar23 = uVar23 + 1;
              }
              pGVar11 = (local_a18->geometries).items
                        [*(uint *)(lVar20 + uVar19 + 0x120 + uVar23 * 4)].ptr;
              if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                local_a28 = local_a28 ^ 1L << (uVar23 & 0x3f);
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_01cc1106:
                  *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                  goto LAB_01cc111a;
                }
                uVar28 = (ulong)(uint)((int)uVar23 * 4);
                uVar8 = *(undefined4 *)(local_8c8 + uVar28);
                local_838._4_4_ = uVar8;
                local_838._0_4_ = uVar8;
                local_838._8_4_ = uVar8;
                local_838._12_4_ = uVar8;
                uVar8 = *(undefined4 *)(local_8b8 + uVar28);
                local_828._4_4_ = uVar8;
                local_828._0_4_ = uVar8;
                local_828._8_4_ = uVar8;
                local_828._12_4_ = uVar8;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_8a8 + uVar28);
                args.context = context->user;
                local_808 = vpbroadcastd_avx512vl();
                uVar8 = *(undefined4 *)(lVar20 + uVar19 + 0x130 + uVar28);
                local_818._4_4_ = uVar8;
                local_818._0_4_ = uVar8;
                local_818._8_4_ = uVar8;
                local_818._12_4_ = uVar8;
                uVar8 = *(undefined4 *)(local_898 + uVar28);
                uVar10 = *(undefined4 *)(local_888 + uVar28);
                local_858._4_4_ = uVar10;
                local_858._0_4_ = uVar10;
                local_858._8_4_ = uVar10;
                local_858._12_4_ = uVar10;
                uVar10 = *(undefined4 *)(local_878 + uVar28);
                local_848._4_4_ = uVar10;
                local_848._0_4_ = uVar10;
                local_848._8_4_ = uVar10;
                local_848._12_4_ = uVar10;
                local_868[0] = (RTCHitN)(char)uVar8;
                local_868[1] = (RTCHitN)(char)((uint)uVar8 >> 8);
                local_868[2] = (RTCHitN)(char)((uint)uVar8 >> 0x10);
                local_868[3] = (RTCHitN)(char)((uint)uVar8 >> 0x18);
                local_868[4] = (RTCHitN)(char)uVar8;
                local_868[5] = (RTCHitN)(char)((uint)uVar8 >> 8);
                local_868[6] = (RTCHitN)(char)((uint)uVar8 >> 0x10);
                local_868[7] = (RTCHitN)(char)((uint)uVar8 >> 0x18);
                local_868[8] = (RTCHitN)(char)uVar8;
                local_868[9] = (RTCHitN)(char)((uint)uVar8 >> 8);
                local_868[10] = (RTCHitN)(char)((uint)uVar8 >> 0x10);
                local_868[0xb] = (RTCHitN)(char)((uint)uVar8 >> 0x18);
                local_868[0xc] = (RTCHitN)(char)uVar8;
                local_868[0xd] = (RTCHitN)(char)((uint)uVar8 >> 8);
                local_868[0xe] = (RTCHitN)(char)((uint)uVar8 >> 0x10);
                local_868[0xf] = (RTCHitN)(char)((uint)uVar8 >> 0x18);
                vpcmpeqd_avx2(ZEXT1632(local_808),ZEXT1632(local_808));
                uStack_7f4 = (args.context)->instID[0];
                local_7f8 = uStack_7f4;
                uStack_7f0 = uStack_7f4;
                uStack_7ec = uStack_7f4;
                uStack_7e8 = (args.context)->instPrimID[0];
                uStack_7e4 = uStack_7e8;
                uStack_7e0 = uStack_7e8;
                uStack_7dc = uStack_7e8;
                args.valid = (int *)local_a38;
                args.geometryUserPtr = pGVar11->userPtr;
                args.hit = local_868;
                args.N = 4;
                local_9a8 = auVar60._0_16_;
                local_9b8 = auVar61._0_16_;
                local_9c8 = auVar62._0_16_;
                local_9d8 = auVar63._0_16_;
                local_9e8 = auVar64._0_16_;
                local_9f8 = auVar65._0_16_;
                local_a08 = auVar57._0_16_;
                local_a38 = auVar29;
                args.ray = (RTCRayN *)ray;
                if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar11->occlusionFilterN)(&args);
                  auVar57 = ZEXT1664(local_a08);
                  auVar65 = ZEXT1664(local_9f8);
                  auVar64 = ZEXT1664(local_9e8);
                  auVar63 = ZEXT1664(local_9d8);
                  auVar62 = ZEXT1664(local_9c8);
                  auVar61 = ZEXT1664(local_9b8);
                  auVar60 = ZEXT1664(local_9a8);
                }
                uVar28 = vptestmd_avx512vl(local_a38,local_a38);
                if ((uVar28 & 0xf) != 0) {
                  p_Var12 = context->args->filter;
                  if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var12)(&args);
                    auVar57 = ZEXT1664(local_a08);
                    auVar65 = ZEXT1664(local_9f8);
                    auVar64 = ZEXT1664(local_9e8);
                    auVar63 = ZEXT1664(local_9d8);
                    auVar62 = ZEXT1664(local_9c8);
                    auVar61 = ZEXT1664(local_9b8);
                    auVar60 = ZEXT1664(local_9a8);
                  }
                  uVar28 = vptestmd_avx512vl(local_a38,local_a38);
                  uVar28 = uVar28 & 0xf;
                  auVar30 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar13 = (bool)((byte)uVar28 & 1);
                  auVar48._0_4_ =
                       (uint)bVar13 * auVar30._0_4_ | (uint)!bVar13 * *(int *)(args.ray + 0x80);
                  bVar13 = (bool)((byte)(uVar28 >> 1) & 1);
                  auVar48._4_4_ =
                       (uint)bVar13 * auVar30._4_4_ | (uint)!bVar13 * *(int *)(args.ray + 0x84);
                  bVar13 = (bool)((byte)(uVar28 >> 2) & 1);
                  auVar48._8_4_ =
                       (uint)bVar13 * auVar30._8_4_ | (uint)!bVar13 * *(int *)(args.ray + 0x88);
                  bVar13 = SUB81(uVar28 >> 3,0);
                  auVar48._12_4_ =
                       (uint)bVar13 * auVar30._12_4_ | (uint)!bVar13 * *(int *)(args.ray + 0x8c);
                  *(undefined1 (*) [16])(args.ray + 0x80) = auVar48;
                  if ((byte)uVar28 != 0) goto LAB_01cc1106;
                }
                *(int *)(ray + k * 4 + 0x80) = auVar57._0_4_;
                local_a28 = local_a28 ^ 1L << (uVar23 & 0x3f);
              }
            } while (local_a28 != 0);
          }
        }
      }
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }